

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperUtils.c
# Opt level: O3

void Map_MappingReportChoices(Map_Man_t *pMan)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  Map_Node_t *pMVar8;
  uint uVar9;
  
  iVar1 = pMan->nOutputs;
  if ((long)iVar1 < 1) {
    pMan->nTravIds = pMan->nTravIds + 1;
    uVar5 = 0;
  }
  else {
    lVar2 = 0;
    uVar5 = 0;
    do {
      uVar6 = *(uint *)(((ulong)pMan->pOutputs[lVar2] & 0xfffffffffffffffe) + 0x1c) >> 5 & 0xffff;
      if (uVar6 < uVar5) {
        uVar6 = uVar5;
      }
      uVar5 = uVar6;
      lVar2 = lVar2 + 1;
    } while (iVar1 != lVar2);
    pMan->nTravIds = pMan->nTravIds + 1;
    if (0 < iVar1) {
      lVar2 = 0;
      do {
        Map_MappingUpdateLevel_rec
                  (pMan,(Map_Node_t *)((ulong)pMan->pOutputs[lVar2] & 0xfffffffffffffffe),0);
        lVar2 = lVar2 + 1;
        iVar1 = pMan->nOutputs;
      } while (lVar2 < iVar1);
      if (0 < iVar1) {
        lVar2 = 0;
        uVar3 = 0;
        do {
          uVar6 = *(uint *)(((ulong)pMan->pOutputs[lVar2] & 0xfffffffffffffffe) + 0x1c) >> 5 &
                  0xffff;
          uVar4 = (ulong)uVar6;
          if (uVar6 < (uint)uVar3) {
            uVar4 = uVar3;
          }
          lVar2 = lVar2 + 1;
          uVar3 = uVar4;
        } while (iVar1 != lVar2);
        goto LAB_00404350;
      }
    }
  }
  uVar4 = 0;
LAB_00404350:
  lVar2 = (long)pMan->vMapObjs->nSize;
  if (lVar2 < 1) {
    uVar6 = 0;
    uVar9 = 0;
  }
  else {
    lVar7 = 0;
    uVar9 = 0;
    uVar6 = 0;
    do {
      pMVar8 = pMan->vMapObjs->pArray[lVar7];
      if ((pMVar8->pRepr == (Map_Node_t *)0x0) && (pMVar8->pNextE != (Map_Node_t *)0x0)) {
        uVar9 = uVar9 + 1;
        do {
          uVar6 = uVar6 + 1;
          pMVar8 = pMVar8->pNextE;
        } while (pMVar8 != (Map_Node_t *)0x0);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != lVar2);
  }
  printf("Maximum level: Original = %d. Reduced due to choices = %d.\n",(ulong)uVar5,uVar4);
  printf("Choice stats:  Choice nodes = %d. Total choices = %d.\n",(ulong)uVar9,(ulong)uVar6);
  return;
}

Assistant:

void Map_MappingReportChoices( Map_Man_t * pMan )
{
    Map_Node_t * pNode, * pTemp;
    int nChoiceNodes, nChoices;
    int i, LevelMax1, LevelMax2;

    // report the number of levels
    LevelMax1 = Map_MappingGetMaxLevel( pMan );
    pMan->nTravIds++;
    for ( i = 0; i < pMan->nOutputs; i++ )
        Map_MappingUpdateLevel_rec( pMan, Map_Regular(pMan->pOutputs[i]), 0 );
    LevelMax2 = Map_MappingGetMaxLevel( pMan );

    // report statistics about choices
    nChoiceNodes = nChoices = 0;
    for ( i = 0; i < pMan->vMapObjs->nSize; i++ )
    {
        pNode = pMan->vMapObjs->pArray[i];
        if ( pNode->pRepr == NULL && pNode->pNextE != NULL )
        { // this is a choice node = the primary node that has equivalent nodes
            nChoiceNodes++;
            for ( pTemp = pNode; pTemp; pTemp = pTemp->pNextE )
                nChoices++;
        }
    }
    printf( "Maximum level: Original = %d. Reduced due to choices = %d.\n", LevelMax1, LevelMax2 );
    printf( "Choice stats:  Choice nodes = %d. Total choices = %d.\n", nChoiceNodes, nChoices );
}